

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwshandshake.hpp
# Opt level: O0

void __thiscall
WebSocketHandshakeKeyGen::static_for<2,_WebSocketHandshakeKeyGen::Sha1Loop<3>_>::operator()
          (static_for<2,_WebSocketHandshakeKeyGen::Sha1Loop<3>_> *this,uint32_t *a,uint32_t *b)

{
  static_for<1,_WebSocketHandshakeKeyGen::Sha1Loop<3>_> local_21;
  uint32_t *local_20;
  uint32_t *b_local;
  uint32_t *a_local;
  static_for<2,_WebSocketHandshakeKeyGen::Sha1Loop<3>_> *this_local;
  
  local_20 = b;
  b_local = a;
  a_local = (uint32_t *)this;
  static_for<1,_WebSocketHandshakeKeyGen::Sha1Loop<3>_>::operator()(&local_21,a,b);
  Sha1Loop<3>::f<1>(b_local,local_20);
  return;
}

Assistant:

void operator()(uint32_t *a, uint32_t *b) {
            static_for<N - 1, T>()(a, b);
            T::template f<N - 1>(a, b);
        }